

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

Vec_Int_t * Gia_SimRsbTfo(Gia_SimRsbMan_t *p,int iObj,int iFanout)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *__base;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  if (iObj < 1) {
    __assert_fail("iObj > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x1b3,"Vec_Int_t *Gia_SimRsbTfo(Gia_SimRsbMan_t *, int, int)");
  }
  p->vTfo->nSize = 0;
  Gia_ManIncrementTravId(p->pGia);
  Gia_SimRsbTfo_rec(p->pGia,iObj,iFanout,p->vTfo);
  pVVar2 = p->vTfo;
  iVar4 = pVVar2->nSize;
  if (0 < (long)iVar4) {
    __base = pVVar2->pArray;
    if (__base[(long)iVar4 + -1] == iObj) {
      uVar3 = iVar4 - 1;
      pVVar2->nSize = uVar3;
      if (1 < uVar3) {
        iVar4 = -1;
        lVar5 = 0;
        do {
          iVar1 = __base[lVar5];
          __base[lVar5] = __base[(int)(uVar3 + iVar4)];
          __base[pVVar2->nSize + iVar4] = iVar1;
          lVar5 = lVar5 + 1;
          uVar3 = pVVar2->nSize;
          iVar4 = iVar4 + -1;
        } while (lVar5 < (int)uVar3 / 2);
      }
      qsort(__base,(long)(int)uVar3,4,Vec_IntSortCompare1);
      return p->vTfo;
    }
    __assert_fail("Vec_IntEntryLast(p->vTfo) == iObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x1b7,"Vec_Int_t *Gia_SimRsbTfo(Gia_SimRsbMan_t *, int, int)");
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gia_SimRsbTfo( Gia_SimRsbMan_t * p, int iObj, int iFanout )
{
    assert( iObj > 0 );
    Vec_IntClear( p->vTfo );
    Gia_ManIncrementTravId( p->pGia );
    Gia_SimRsbTfo_rec( p->pGia, iObj, iFanout, p->vTfo );
    assert( Vec_IntEntryLast(p->vTfo) == iObj );
    Vec_IntPop( p->vTfo );
    Vec_IntReverseOrder( p->vTfo );
    Vec_IntSort( p->vTfo, 0 );
    return p->vTfo;
}